

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall llvm::cl::Option::addArgument(Option *this)

{
  uint uVar1;
  atomic<void_*> this_00;
  void **ppvVar2;
  uint *puVar3;
  SmallPtrSetIteratorImpl local_40;
  SmallPtrSetIteratorImpl local_30;
  
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               object_creator<(anonymous_namespace)::CommandLineParser>::call,
               object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  this_00._M_b._M_p = GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p;
  uVar1 = (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
          NumNonEmpty;
  if (uVar1 == (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
               NumTombstones) {
    if (TopLevelSubCommand == (SubCommand *)0x0) {
      ManagedStaticBase::RegisterManagedStatic
                ((ManagedStaticBase *)&TopLevelSubCommand,object_creator<llvm::cl::SubCommand>::call
                 ,object_deleter<llvm::cl::SubCommand>::call);
    }
    anon_unknown.dwarf_299de3::CommandLineParser::addOption
              ((CommandLineParser *)this_00._M_b._M_p,this,TopLevelSubCommand);
  }
  else {
    local_30.Bucket =
         (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
         CurArray;
    if (local_30.Bucket !=
        (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
        SmallArray) {
      uVar1 = (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
              CurArraySize;
    }
    local_30.End = local_30.Bucket + uVar1;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_30);
    local_40.Bucket = local_30.Bucket;
    local_40.End = local_30.End;
    local_30.Bucket =
         (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
         CurArray;
    puVar3 = &(this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
              NumNonEmpty;
    if (local_30.Bucket !=
        (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
        SmallArray) {
      puVar3 = &(this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase
                .CurArraySize;
    }
    local_30.Bucket = local_30.Bucket + *puVar3;
    local_30.End = local_30.Bucket;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_30);
    ppvVar2 = local_30.Bucket;
    if (local_40.Bucket != local_30.Bucket) {
      do {
        if (local_40.End <= local_40.Bucket) {
          __assert_fail("Bucket < End",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                        ,0x122,
                        "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                       );
        }
        anon_unknown.dwarf_299de3::CommandLineParser::addOption
                  ((CommandLineParser *)this_00._M_b._M_p,this,(SubCommand *)*local_40.Bucket);
        local_40.Bucket = local_40.Bucket + 1;
        SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_40);
      } while (local_40.Bucket != ppvVar2);
    }
  }
  this->FullyInitialized = true;
  return;
}

Assistant:

void Option::addArgument() {
  GlobalParser->addOption(this);
  FullyInitialized = true;
}